

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

lgx_symbol_t * lgx_symbol_get(lgx_ast_node_t *node,lgx_str_t *name,uint offset)

{
  lgx_symbol_t *plVar1;
  lgx_ht_node_t *plVar2;
  
  do {
    if ((*(char *)node == '\x01') &&
       (plVar2 = lgx_ht_get((node->u).symbols,name), plVar2 != (lgx_ht_node_t *)0x0)) {
      plVar1 = (lgx_symbol_t *)plVar2->v;
      if ((node->parent == (lgx_ast_node_s *)0x0) &&
         ((plVar1->s_type == S_CONSTANT && ((plVar1->type).type == T_FUNCTION)))) {
        return plVar1;
      }
      if (plVar1->node->offset <= offset) {
        return plVar1;
      }
    }
    node = node->parent;
    if (node == (lgx_ast_node_s *)0x0) {
      return (lgx_symbol_t *)0x0;
    }
  } while( true );
}

Assistant:

lgx_symbol_t* lgx_symbol_get(lgx_ast_node_t* node, lgx_str_t* name, unsigned offset) {
    if (node->type == BLOCK_STATEMENT) {
        lgx_ht_node_t* ht_node = lgx_ht_get(node->u.symbols, name);
        if (ht_node) {
            lgx_symbol_t* n = (lgx_symbol_t*)ht_node->v;
            // 全局函数不需要遵循先声明后使用的原则
            if ((node->parent == NULL && n->s_type == S_CONSTANT && n->type.type == T_FUNCTION) ||
                n->node->offset <= offset) {
                return n;
            }
        }
    }

    if (!node->parent) {
        return NULL;
    }

    return lgx_symbol_get(node->parent, name, offset);
}